

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol.c
# Opt level: O0

int KINAllocVectors(KINMem kin_mem,N_Vector tmpl)

{
  N_Vector p_Var1;
  sunrealtype *psVar2;
  N_Vector *pp_Var3;
  SUNQRData p_Var4;
  undefined8 in_RSI;
  KINMem in_RDI;
  
  if (in_RDI->kin_unew == (N_Vector)0x0) {
    p_Var1 = (N_Vector)N_VClone(in_RSI);
    in_RDI->kin_unew = p_Var1;
    if (in_RDI->kin_unew == (N_Vector)0x0) {
      return 0;
    }
    in_RDI->kin_liw = in_RDI->kin_liw1 + in_RDI->kin_liw;
    in_RDI->kin_lrw = in_RDI->kin_lrw1 + in_RDI->kin_lrw;
  }
  if (in_RDI->kin_fval == (N_Vector)0x0) {
    p_Var1 = (N_Vector)N_VClone(in_RSI);
    in_RDI->kin_fval = p_Var1;
    if (in_RDI->kin_fval == (N_Vector)0x0) {
      N_VDestroy(in_RDI->kin_unew);
      in_RDI->kin_liw = in_RDI->kin_liw - in_RDI->kin_liw1;
      in_RDI->kin_lrw = in_RDI->kin_lrw - in_RDI->kin_lrw1;
      return 0;
    }
    in_RDI->kin_liw = in_RDI->kin_liw1 + in_RDI->kin_liw;
    in_RDI->kin_lrw = in_RDI->kin_lrw1 + in_RDI->kin_lrw;
  }
  if (in_RDI->kin_pp == (N_Vector)0x0) {
    p_Var1 = (N_Vector)N_VClone(in_RSI);
    in_RDI->kin_pp = p_Var1;
    if (in_RDI->kin_pp == (N_Vector)0x0) {
      N_VDestroy(in_RDI->kin_unew);
      N_VDestroy(in_RDI->kin_fval);
      in_RDI->kin_liw = in_RDI->kin_liw + in_RDI->kin_liw1 * -2;
      in_RDI->kin_lrw = in_RDI->kin_lrw + in_RDI->kin_lrw1 * -2;
      return 0;
    }
    in_RDI->kin_liw = in_RDI->kin_liw1 + in_RDI->kin_liw;
    in_RDI->kin_lrw = in_RDI->kin_lrw1 + in_RDI->kin_lrw;
  }
  if (in_RDI->kin_vtemp1 == (N_Vector)0x0) {
    p_Var1 = (N_Vector)N_VClone(in_RSI);
    in_RDI->kin_vtemp1 = p_Var1;
    if (in_RDI->kin_vtemp1 == (N_Vector)0x0) {
      N_VDestroy(in_RDI->kin_unew);
      N_VDestroy(in_RDI->kin_fval);
      N_VDestroy(in_RDI->kin_pp);
      in_RDI->kin_liw = in_RDI->kin_liw + in_RDI->kin_liw1 * -3;
      in_RDI->kin_lrw = in_RDI->kin_lrw + in_RDI->kin_lrw1 * -3;
      return 0;
    }
    in_RDI->kin_liw = in_RDI->kin_liw1 + in_RDI->kin_liw;
    in_RDI->kin_lrw = in_RDI->kin_lrw1 + in_RDI->kin_lrw;
  }
  if (in_RDI->kin_vtemp2 == (N_Vector)0x0) {
    p_Var1 = (N_Vector)N_VClone(in_RSI);
    in_RDI->kin_vtemp2 = p_Var1;
    if (in_RDI->kin_vtemp2 == (N_Vector)0x0) {
      N_VDestroy(in_RDI->kin_unew);
      N_VDestroy(in_RDI->kin_fval);
      N_VDestroy(in_RDI->kin_pp);
      N_VDestroy(in_RDI->kin_vtemp1);
      in_RDI->kin_liw = in_RDI->kin_liw + in_RDI->kin_liw1 * -4;
      in_RDI->kin_lrw = in_RDI->kin_lrw + in_RDI->kin_lrw1 * -4;
      return 0;
    }
    in_RDI->kin_liw = in_RDI->kin_liw1 + in_RDI->kin_liw;
    in_RDI->kin_lrw = in_RDI->kin_lrw1 + in_RDI->kin_lrw;
  }
  if (in_RDI->kin_m_aa != 0) {
    if (in_RDI->kin_R_aa == (sunrealtype *)0x0) {
      psVar2 = (sunrealtype *)malloc(in_RDI->kin_m_aa * in_RDI->kin_m_aa * 8);
      in_RDI->kin_R_aa = psVar2;
      if (in_RDI->kin_R_aa == (sunrealtype *)0x0) {
        KINProcessError(in_RDI,0,0x3ad,"KINAllocVectors",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/kinsol/kinsol.c"
                        ,"A memory request failed.");
        N_VDestroy(in_RDI->kin_unew);
        N_VDestroy(in_RDI->kin_fval);
        N_VDestroy(in_RDI->kin_pp);
        N_VDestroy(in_RDI->kin_vtemp1);
        N_VDestroy(in_RDI->kin_vtemp2);
        in_RDI->kin_liw = in_RDI->kin_liw + in_RDI->kin_liw1 * -5;
        in_RDI->kin_lrw = in_RDI->kin_lrw + in_RDI->kin_lrw1 * -5;
        return -4;
      }
    }
    if (in_RDI->kin_gamma_aa == (sunrealtype *)0x0) {
      psVar2 = (sunrealtype *)malloc(in_RDI->kin_m_aa << 3);
      in_RDI->kin_gamma_aa = psVar2;
      if (in_RDI->kin_gamma_aa == (sunrealtype *)0x0) {
        KINProcessError(in_RDI,0,0x3bf,"KINAllocVectors",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/kinsol/kinsol.c"
                        ,"A memory request failed.");
        N_VDestroy(in_RDI->kin_unew);
        N_VDestroy(in_RDI->kin_fval);
        N_VDestroy(in_RDI->kin_pp);
        N_VDestroy(in_RDI->kin_vtemp1);
        N_VDestroy(in_RDI->kin_vtemp2);
        free(in_RDI->kin_R_aa);
        in_RDI->kin_liw = in_RDI->kin_liw + in_RDI->kin_liw1 * -5;
        in_RDI->kin_lrw = in_RDI->kin_lrw + in_RDI->kin_lrw1 * -5;
        return -4;
      }
    }
    if (in_RDI->kin_cv == (sunrealtype *)0x0) {
      psVar2 = (sunrealtype *)malloc((in_RDI->kin_m_aa + 1) * 0x10);
      in_RDI->kin_cv = psVar2;
      if (in_RDI->kin_cv == (sunrealtype *)0x0) {
        KINProcessError(in_RDI,0,0x3d2,"KINAllocVectors",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/kinsol/kinsol.c"
                        ,"A memory request failed.");
        N_VDestroy(in_RDI->kin_unew);
        N_VDestroy(in_RDI->kin_fval);
        N_VDestroy(in_RDI->kin_pp);
        N_VDestroy(in_RDI->kin_vtemp1);
        N_VDestroy(in_RDI->kin_vtemp2);
        free(in_RDI->kin_R_aa);
        free(in_RDI->kin_gamma_aa);
        in_RDI->kin_liw = in_RDI->kin_liw + in_RDI->kin_liw1 * -5;
        in_RDI->kin_lrw = in_RDI->kin_lrw + in_RDI->kin_lrw1 * -5;
        return -4;
      }
    }
    if (in_RDI->kin_Xv == (N_Vector *)0x0) {
      pp_Var3 = (N_Vector *)malloc((in_RDI->kin_m_aa + 1) * 0x10);
      in_RDI->kin_Xv = pp_Var3;
      if (in_RDI->kin_Xv == (N_Vector *)0x0) {
        KINProcessError(in_RDI,0,0x3e6,"KINAllocVectors",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/kinsol/kinsol.c"
                        ,"A memory request failed.");
        N_VDestroy(in_RDI->kin_unew);
        N_VDestroy(in_RDI->kin_fval);
        N_VDestroy(in_RDI->kin_pp);
        N_VDestroy(in_RDI->kin_vtemp1);
        N_VDestroy(in_RDI->kin_vtemp2);
        free(in_RDI->kin_R_aa);
        free(in_RDI->kin_gamma_aa);
        free(in_RDI->kin_cv);
        in_RDI->kin_liw = in_RDI->kin_liw + in_RDI->kin_liw1 * -5;
        in_RDI->kin_lrw = in_RDI->kin_lrw + in_RDI->kin_lrw1 * -5;
        return -4;
      }
    }
    if (in_RDI->kin_fold_aa == (N_Vector)0x0) {
      p_Var1 = (N_Vector)N_VClone(in_RSI);
      in_RDI->kin_fold_aa = p_Var1;
      if (in_RDI->kin_fold_aa == (N_Vector)0x0) {
        N_VDestroy(in_RDI->kin_unew);
        N_VDestroy(in_RDI->kin_fval);
        N_VDestroy(in_RDI->kin_pp);
        N_VDestroy(in_RDI->kin_vtemp1);
        N_VDestroy(in_RDI->kin_vtemp2);
        free(in_RDI->kin_R_aa);
        free(in_RDI->kin_gamma_aa);
        free(in_RDI->kin_cv);
        free(in_RDI->kin_Xv);
        in_RDI->kin_liw = in_RDI->kin_liw + in_RDI->kin_liw1 * -5;
        in_RDI->kin_lrw = in_RDI->kin_lrw + in_RDI->kin_lrw1 * -5;
        return 0;
      }
      in_RDI->kin_liw = in_RDI->kin_liw1 + in_RDI->kin_liw;
      in_RDI->kin_lrw = in_RDI->kin_lrw1 + in_RDI->kin_lrw;
    }
    if (in_RDI->kin_gold_aa == (N_Vector)0x0) {
      p_Var1 = (N_Vector)N_VClone(in_RSI);
      in_RDI->kin_gold_aa = p_Var1;
      if (in_RDI->kin_gold_aa == (N_Vector)0x0) {
        N_VDestroy(in_RDI->kin_unew);
        N_VDestroy(in_RDI->kin_fval);
        N_VDestroy(in_RDI->kin_pp);
        N_VDestroy(in_RDI->kin_vtemp1);
        N_VDestroy(in_RDI->kin_vtemp2);
        free(in_RDI->kin_R_aa);
        free(in_RDI->kin_gamma_aa);
        free(in_RDI->kin_cv);
        free(in_RDI->kin_Xv);
        N_VDestroy(in_RDI->kin_fold_aa);
        in_RDI->kin_liw = in_RDI->kin_liw + in_RDI->kin_liw1 * -6;
        in_RDI->kin_lrw = in_RDI->kin_lrw + in_RDI->kin_lrw1 * -6;
        return 0;
      }
      in_RDI->kin_liw = in_RDI->kin_liw1 + in_RDI->kin_liw;
      in_RDI->kin_lrw = in_RDI->kin_lrw1 + in_RDI->kin_lrw;
    }
    if (in_RDI->kin_df_aa == (N_Vector *)0x0) {
      pp_Var3 = (N_Vector *)N_VCloneVectorArray(in_RDI->kin_m_aa & 0xffffffff,in_RSI);
      in_RDI->kin_df_aa = pp_Var3;
      if (in_RDI->kin_df_aa == (N_Vector *)0x0) {
        N_VDestroy(in_RDI->kin_unew);
        N_VDestroy(in_RDI->kin_fval);
        N_VDestroy(in_RDI->kin_pp);
        N_VDestroy(in_RDI->kin_vtemp1);
        N_VDestroy(in_RDI->kin_vtemp2);
        free(in_RDI->kin_R_aa);
        free(in_RDI->kin_gamma_aa);
        free(in_RDI->kin_cv);
        free(in_RDI->kin_Xv);
        N_VDestroy(in_RDI->kin_fold_aa);
        N_VDestroy(in_RDI->kin_gold_aa);
        in_RDI->kin_liw = in_RDI->kin_liw + in_RDI->kin_liw1 * -7;
        in_RDI->kin_lrw = in_RDI->kin_lrw + in_RDI->kin_lrw1 * -7;
        return 0;
      }
      in_RDI->kin_liw = in_RDI->kin_m_aa * in_RDI->kin_liw1 + in_RDI->kin_liw;
      in_RDI->kin_lrw = in_RDI->kin_m_aa * in_RDI->kin_lrw1 + in_RDI->kin_lrw;
    }
    if (in_RDI->kin_dg_aa == (N_Vector *)0x0) {
      pp_Var3 = (N_Vector *)N_VCloneVectorArray(in_RDI->kin_m_aa & 0xffffffff,in_RSI);
      in_RDI->kin_dg_aa = pp_Var3;
      if (in_RDI->kin_dg_aa == (N_Vector *)0x0) {
        N_VDestroy(in_RDI->kin_unew);
        N_VDestroy(in_RDI->kin_fval);
        N_VDestroy(in_RDI->kin_pp);
        N_VDestroy(in_RDI->kin_vtemp1);
        N_VDestroy(in_RDI->kin_vtemp2);
        free(in_RDI->kin_R_aa);
        free(in_RDI->kin_gamma_aa);
        free(in_RDI->kin_cv);
        free(in_RDI->kin_Xv);
        N_VDestroy(in_RDI->kin_fold_aa);
        N_VDestroy(in_RDI->kin_gold_aa);
        N_VDestroyVectorArray(in_RDI->kin_df_aa,in_RDI->kin_m_aa & 0xffffffff);
        in_RDI->kin_liw = in_RDI->kin_liw - (in_RDI->kin_m_aa + 7) * in_RDI->kin_liw1;
        in_RDI->kin_lrw = in_RDI->kin_lrw - (in_RDI->kin_m_aa + 7) * in_RDI->kin_lrw1;
        return 0;
      }
      in_RDI->kin_liw = in_RDI->kin_m_aa * in_RDI->kin_liw1 + in_RDI->kin_liw;
      in_RDI->kin_lrw = in_RDI->kin_m_aa * in_RDI->kin_lrw1 + in_RDI->kin_lrw;
    }
    if (in_RDI->kin_q_aa == (N_Vector *)0x0) {
      pp_Var3 = (N_Vector *)N_VCloneVectorArray(in_RDI->kin_m_aa & 0xffffffff,in_RSI);
      in_RDI->kin_q_aa = pp_Var3;
      if (in_RDI->kin_q_aa == (N_Vector *)0x0) {
        N_VDestroy(in_RDI->kin_unew);
        N_VDestroy(in_RDI->kin_fval);
        N_VDestroy(in_RDI->kin_pp);
        N_VDestroy(in_RDI->kin_vtemp1);
        N_VDestroy(in_RDI->kin_vtemp2);
        free(in_RDI->kin_R_aa);
        free(in_RDI->kin_gamma_aa);
        free(in_RDI->kin_cv);
        free(in_RDI->kin_Xv);
        N_VDestroy(in_RDI->kin_fold_aa);
        N_VDestroy(in_RDI->kin_gold_aa);
        N_VDestroyVectorArray(in_RDI->kin_df_aa,in_RDI->kin_m_aa & 0xffffffff);
        N_VDestroyVectorArray(in_RDI->kin_dg_aa,in_RDI->kin_m_aa & 0xffffffff);
        in_RDI->kin_liw = in_RDI->kin_liw - (in_RDI->kin_m_aa * 2 + 7) * in_RDI->kin_liw1;
        in_RDI->kin_lrw = in_RDI->kin_lrw - (in_RDI->kin_m_aa * 2 + 7) * in_RDI->kin_lrw1;
        return 0;
      }
      in_RDI->kin_liw = in_RDI->kin_m_aa * in_RDI->kin_liw1 + in_RDI->kin_liw;
      in_RDI->kin_lrw = in_RDI->kin_m_aa * in_RDI->kin_lrw1 + in_RDI->kin_lrw;
    }
    if (in_RDI->kin_qr_data == (SUNQRData)0x0) {
      p_Var4 = (SUNQRData)malloc(0x18);
      in_RDI->kin_qr_data = p_Var4;
      if (in_RDI->kin_qr_data == (SUNQRData)0x0) {
        N_VDestroy(in_RDI->kin_unew);
        N_VDestroy(in_RDI->kin_fval);
        N_VDestroy(in_RDI->kin_pp);
        N_VDestroy(in_RDI->kin_vtemp1);
        N_VDestroy(in_RDI->kin_vtemp2);
        free(in_RDI->kin_R_aa);
        free(in_RDI->kin_gamma_aa);
        free(in_RDI->kin_cv);
        free(in_RDI->kin_Xv);
        N_VDestroy(in_RDI->kin_fold_aa);
        N_VDestroy(in_RDI->kin_gold_aa);
        N_VDestroyVectorArray(in_RDI->kin_df_aa,in_RDI->kin_m_aa & 0xffffffff);
        N_VDestroyVectorArray(in_RDI->kin_dg_aa,in_RDI->kin_m_aa & 0xffffffff);
        N_VDestroyVectorArray(in_RDI->kin_q_aa,in_RDI->kin_m_aa & 0xffffffff);
        in_RDI->kin_liw = in_RDI->kin_liw - (in_RDI->kin_m_aa * 3 + 7) * in_RDI->kin_liw1;
        in_RDI->kin_lrw = in_RDI->kin_lrw - (in_RDI->kin_m_aa * 3 + 7) * in_RDI->kin_lrw1;
        return -4;
      }
      in_RDI->kin_liw = in_RDI->kin_m_aa * in_RDI->kin_liw1 + in_RDI->kin_liw;
      in_RDI->kin_lrw = in_RDI->kin_m_aa * in_RDI->kin_lrw1 + in_RDI->kin_lrw;
    }
    if (in_RDI->kin_orth_aa != 0) {
      if (in_RDI->kin_vtemp3 == (N_Vector)0x0) {
        p_Var1 = (N_Vector)N_VClone(in_RSI);
        in_RDI->kin_vtemp3 = p_Var1;
        if (in_RDI->kin_vtemp3 == (N_Vector)0x0) {
          N_VDestroy(in_RDI->kin_unew);
          N_VDestroy(in_RDI->kin_fval);
          N_VDestroy(in_RDI->kin_pp);
          N_VDestroy(in_RDI->kin_vtemp1);
          N_VDestroy(in_RDI->kin_vtemp2);
          free(in_RDI->kin_R_aa);
          free(in_RDI->kin_gamma_aa);
          free(in_RDI->kin_cv);
          free(in_RDI->kin_Xv);
          N_VDestroy(in_RDI->kin_fold_aa);
          N_VDestroy(in_RDI->kin_gold_aa);
          N_VDestroyVectorArray(in_RDI->kin_df_aa,in_RDI->kin_m_aa & 0xffffffff);
          N_VDestroyVectorArray(in_RDI->kin_dg_aa,in_RDI->kin_m_aa & 0xffffffff);
          N_VDestroyVectorArray(in_RDI->kin_q_aa,in_RDI->kin_m_aa & 0xffffffff);
          free(in_RDI->kin_qr_data);
          in_RDI->kin_liw = in_RDI->kin_liw - (in_RDI->kin_m_aa * 3 + 7) * in_RDI->kin_liw1;
          in_RDI->kin_lrw = in_RDI->kin_lrw - (in_RDI->kin_m_aa * 3 + 7) * in_RDI->kin_lrw1;
          return 0;
        }
        in_RDI->kin_liw = in_RDI->kin_liw1 + in_RDI->kin_liw;
        in_RDI->kin_lrw = in_RDI->kin_lrw1 + in_RDI->kin_lrw;
      }
      if ((in_RDI->kin_orth_aa == 1) && (in_RDI->kin_T_aa == (sunrealtype *)0x0)) {
        psVar2 = (sunrealtype *)malloc(in_RDI->kin_m_aa * in_RDI->kin_m_aa * 8);
        in_RDI->kin_T_aa = psVar2;
        if (in_RDI->kin_T_aa == (sunrealtype *)0x0) {
          KINProcessError(in_RDI,0,0x4ae,"KINAllocVectors",
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/kinsol/kinsol.c"
                          ,"A memory request failed.");
          N_VDestroy(in_RDI->kin_unew);
          N_VDestroy(in_RDI->kin_fval);
          N_VDestroy(in_RDI->kin_pp);
          N_VDestroy(in_RDI->kin_vtemp1);
          N_VDestroy(in_RDI->kin_vtemp2);
          free(in_RDI->kin_R_aa);
          free(in_RDI->kin_gamma_aa);
          free(in_RDI->kin_cv);
          free(in_RDI->kin_Xv);
          N_VDestroy(in_RDI->kin_fold_aa);
          N_VDestroy(in_RDI->kin_gold_aa);
          N_VDestroyVectorArray(in_RDI->kin_df_aa,in_RDI->kin_m_aa & 0xffffffff);
          N_VDestroyVectorArray(in_RDI->kin_dg_aa,in_RDI->kin_m_aa & 0xffffffff);
          N_VDestroyVectorArray(in_RDI->kin_q_aa,in_RDI->kin_m_aa & 0xffffffff);
          free(in_RDI->kin_qr_data);
          N_VDestroy(in_RDI->kin_vtemp3);
          in_RDI->kin_liw = in_RDI->kin_liw - (in_RDI->kin_m_aa * 3 + 8) * in_RDI->kin_liw1;
          in_RDI->kin_lrw = in_RDI->kin_lrw - (in_RDI->kin_m_aa * 3 + 8) * in_RDI->kin_lrw1;
          return -4;
        }
      }
    }
  }
  return 1;
}

Assistant:

static sunbooleantype KINAllocVectors(KINMem kin_mem, N_Vector tmpl)
{
  /* allocate unew, fval, pp, vtemp1 and vtemp2. */
  /* allocate df, dg, q, for Anderson Acceleration, Broyden and EN */
  /* allocate L, for Low Sync Anderson Acceleration */

  if (kin_mem->kin_unew == NULL)
  {
    kin_mem->kin_unew = N_VClone(tmpl);
    if (kin_mem->kin_unew == NULL) { return (SUNFALSE); }
    kin_mem->kin_liw += kin_mem->kin_liw1;
    kin_mem->kin_lrw += kin_mem->kin_lrw1;
  }

  if (kin_mem->kin_fval == NULL)
  {
    kin_mem->kin_fval = N_VClone(tmpl);
    if (kin_mem->kin_fval == NULL)
    {
      N_VDestroy(kin_mem->kin_unew);
      kin_mem->kin_liw -= kin_mem->kin_liw1;
      kin_mem->kin_lrw -= kin_mem->kin_lrw1;
      return (SUNFALSE);
    }
    kin_mem->kin_liw += kin_mem->kin_liw1;
    kin_mem->kin_lrw += kin_mem->kin_lrw1;
  }

  if (kin_mem->kin_pp == NULL)
  {
    kin_mem->kin_pp = N_VClone(tmpl);
    if (kin_mem->kin_pp == NULL)
    {
      N_VDestroy(kin_mem->kin_unew);
      N_VDestroy(kin_mem->kin_fval);
      kin_mem->kin_liw -= 2 * kin_mem->kin_liw1;
      kin_mem->kin_lrw -= 2 * kin_mem->kin_lrw1;
      return (SUNFALSE);
    }
    kin_mem->kin_liw += kin_mem->kin_liw1;
    kin_mem->kin_lrw += kin_mem->kin_lrw1;
  }

  if (kin_mem->kin_vtemp1 == NULL)
  {
    kin_mem->kin_vtemp1 = N_VClone(tmpl);
    if (kin_mem->kin_vtemp1 == NULL)
    {
      N_VDestroy(kin_mem->kin_unew);
      N_VDestroy(kin_mem->kin_fval);
      N_VDestroy(kin_mem->kin_pp);
      kin_mem->kin_liw -= 3 * kin_mem->kin_liw1;
      kin_mem->kin_lrw -= 3 * kin_mem->kin_lrw1;
      return (SUNFALSE);
    }
    kin_mem->kin_liw += kin_mem->kin_liw1;
    kin_mem->kin_lrw += kin_mem->kin_lrw1;
  }

  if (kin_mem->kin_vtemp2 == NULL)
  {
    kin_mem->kin_vtemp2 = N_VClone(tmpl);
    if (kin_mem->kin_vtemp2 == NULL)
    {
      N_VDestroy(kin_mem->kin_unew);
      N_VDestroy(kin_mem->kin_fval);
      N_VDestroy(kin_mem->kin_pp);
      N_VDestroy(kin_mem->kin_vtemp1);
      kin_mem->kin_liw -= 4 * kin_mem->kin_liw1;
      kin_mem->kin_lrw -= 4 * kin_mem->kin_lrw1;
      return (SUNFALSE);
    }
    kin_mem->kin_liw += kin_mem->kin_liw1;
    kin_mem->kin_lrw += kin_mem->kin_lrw1;
  }

  /* Vectors for Anderson acceleration */

  if (kin_mem->kin_m_aa)
  {
    if (kin_mem->kin_R_aa == NULL)
    {
      kin_mem->kin_R_aa = (sunrealtype*)malloc(
        (kin_mem->kin_m_aa * kin_mem->kin_m_aa) * sizeof(sunrealtype));
      if (kin_mem->kin_R_aa == NULL)
      {
        KINProcessError(kin_mem, 0, __LINE__, __func__, __FILE__, MSG_MEM_FAIL);
        N_VDestroy(kin_mem->kin_unew);
        N_VDestroy(kin_mem->kin_fval);
        N_VDestroy(kin_mem->kin_pp);
        N_VDestroy(kin_mem->kin_vtemp1);
        N_VDestroy(kin_mem->kin_vtemp2);
        kin_mem->kin_liw -= 5 * kin_mem->kin_liw1;
        kin_mem->kin_lrw -= 5 * kin_mem->kin_lrw1;
        return (KIN_MEM_FAIL);
      }
    }

    if (kin_mem->kin_gamma_aa == NULL)
    {
      kin_mem->kin_gamma_aa =
        (sunrealtype*)malloc(kin_mem->kin_m_aa * sizeof(sunrealtype));
      if (kin_mem->kin_gamma_aa == NULL)
      {
        KINProcessError(kin_mem, 0, __LINE__, __func__, __FILE__, MSG_MEM_FAIL);
        N_VDestroy(kin_mem->kin_unew);
        N_VDestroy(kin_mem->kin_fval);
        N_VDestroy(kin_mem->kin_pp);
        N_VDestroy(kin_mem->kin_vtemp1);
        N_VDestroy(kin_mem->kin_vtemp2);
        free(kin_mem->kin_R_aa);
        kin_mem->kin_liw -= 5 * kin_mem->kin_liw1;
        kin_mem->kin_lrw -= 5 * kin_mem->kin_lrw1;
        return (KIN_MEM_FAIL);
      }
    }

    if (kin_mem->kin_cv == NULL)
    {
      kin_mem->kin_cv =
        (sunrealtype*)malloc(2 * (kin_mem->kin_m_aa + 1) * sizeof(sunrealtype));
      if (kin_mem->kin_cv == NULL)
      {
        KINProcessError(kin_mem, 0, __LINE__, __func__, __FILE__, MSG_MEM_FAIL);
        N_VDestroy(kin_mem->kin_unew);
        N_VDestroy(kin_mem->kin_fval);
        N_VDestroy(kin_mem->kin_pp);
        N_VDestroy(kin_mem->kin_vtemp1);
        N_VDestroy(kin_mem->kin_vtemp2);
        free(kin_mem->kin_R_aa);
        free(kin_mem->kin_gamma_aa);
        kin_mem->kin_liw -= 5 * kin_mem->kin_liw1;
        kin_mem->kin_lrw -= 5 * kin_mem->kin_lrw1;
        return (KIN_MEM_FAIL);
      }
    }

    if (kin_mem->kin_Xv == NULL)
    {
      kin_mem->kin_Xv =
        (N_Vector*)malloc(2 * (kin_mem->kin_m_aa + 1) * sizeof(N_Vector));
      if (kin_mem->kin_Xv == NULL)
      {
        KINProcessError(kin_mem, 0, __LINE__, __func__, __FILE__, MSG_MEM_FAIL);
        N_VDestroy(kin_mem->kin_unew);
        N_VDestroy(kin_mem->kin_fval);
        N_VDestroy(kin_mem->kin_pp);
        N_VDestroy(kin_mem->kin_vtemp1);
        N_VDestroy(kin_mem->kin_vtemp2);
        free(kin_mem->kin_R_aa);
        free(kin_mem->kin_gamma_aa);
        free(kin_mem->kin_cv);
        kin_mem->kin_liw -= 5 * kin_mem->kin_liw1;
        kin_mem->kin_lrw -= 5 * kin_mem->kin_lrw1;
        return (KIN_MEM_FAIL);
      }
    }

    if (kin_mem->kin_fold_aa == NULL)
    {
      kin_mem->kin_fold_aa = N_VClone(tmpl);
      if (kin_mem->kin_fold_aa == NULL)
      {
        N_VDestroy(kin_mem->kin_unew);
        N_VDestroy(kin_mem->kin_fval);
        N_VDestroy(kin_mem->kin_pp);
        N_VDestroy(kin_mem->kin_vtemp1);
        N_VDestroy(kin_mem->kin_vtemp2);
        free(kin_mem->kin_R_aa);
        free(kin_mem->kin_gamma_aa);
        free(kin_mem->kin_cv);
        free(kin_mem->kin_Xv);
        kin_mem->kin_liw -= 5 * kin_mem->kin_liw1;
        kin_mem->kin_lrw -= 5 * kin_mem->kin_lrw1;
        return (SUNFALSE);
      }
      kin_mem->kin_liw += kin_mem->kin_liw1;
      kin_mem->kin_lrw += kin_mem->kin_lrw1;
    }

    if (kin_mem->kin_gold_aa == NULL)
    {
      kin_mem->kin_gold_aa = N_VClone(tmpl);
      if (kin_mem->kin_gold_aa == NULL)
      {
        N_VDestroy(kin_mem->kin_unew);
        N_VDestroy(kin_mem->kin_fval);
        N_VDestroy(kin_mem->kin_pp);
        N_VDestroy(kin_mem->kin_vtemp1);
        N_VDestroy(kin_mem->kin_vtemp2);
        free(kin_mem->kin_R_aa);
        free(kin_mem->kin_gamma_aa);
        free(kin_mem->kin_cv);
        free(kin_mem->kin_Xv);
        N_VDestroy(kin_mem->kin_fold_aa);
        kin_mem->kin_liw -= 6 * kin_mem->kin_liw1;
        kin_mem->kin_lrw -= 6 * kin_mem->kin_lrw1;
        return (SUNFALSE);
      }
      kin_mem->kin_liw += kin_mem->kin_liw1;
      kin_mem->kin_lrw += kin_mem->kin_lrw1;
    }

    if (kin_mem->kin_df_aa == NULL)
    {
      kin_mem->kin_df_aa = N_VCloneVectorArray((int)kin_mem->kin_m_aa, tmpl);
      if (kin_mem->kin_df_aa == NULL)
      {
        N_VDestroy(kin_mem->kin_unew);
        N_VDestroy(kin_mem->kin_fval);
        N_VDestroy(kin_mem->kin_pp);
        N_VDestroy(kin_mem->kin_vtemp1);
        N_VDestroy(kin_mem->kin_vtemp2);
        free(kin_mem->kin_R_aa);
        free(kin_mem->kin_gamma_aa);
        free(kin_mem->kin_cv);
        free(kin_mem->kin_Xv);
        N_VDestroy(kin_mem->kin_fold_aa);
        N_VDestroy(kin_mem->kin_gold_aa);
        kin_mem->kin_liw -= 7 * kin_mem->kin_liw1;
        kin_mem->kin_lrw -= 7 * kin_mem->kin_lrw1;
        return (SUNFALSE);
      }
      kin_mem->kin_liw += kin_mem->kin_m_aa * kin_mem->kin_liw1;
      kin_mem->kin_lrw += kin_mem->kin_m_aa * kin_mem->kin_lrw1;
    }

    if (kin_mem->kin_dg_aa == NULL)
    {
      kin_mem->kin_dg_aa = N_VCloneVectorArray((int)kin_mem->kin_m_aa, tmpl);
      if (kin_mem->kin_dg_aa == NULL)
      {
        N_VDestroy(kin_mem->kin_unew);
        N_VDestroy(kin_mem->kin_fval);
        N_VDestroy(kin_mem->kin_pp);
        N_VDestroy(kin_mem->kin_vtemp1);
        N_VDestroy(kin_mem->kin_vtemp2);
        free(kin_mem->kin_R_aa);
        free(kin_mem->kin_gamma_aa);
        free(kin_mem->kin_cv);
        free(kin_mem->kin_Xv);
        N_VDestroy(kin_mem->kin_fold_aa);
        N_VDestroy(kin_mem->kin_gold_aa);
        N_VDestroyVectorArray(kin_mem->kin_df_aa, (int)kin_mem->kin_m_aa);
        kin_mem->kin_liw -= (7 + kin_mem->kin_m_aa) * kin_mem->kin_liw1;
        kin_mem->kin_lrw -= (7 + kin_mem->kin_m_aa) * kin_mem->kin_lrw1;
        return (SUNFALSE);
      }
      kin_mem->kin_liw += kin_mem->kin_m_aa * kin_mem->kin_liw1;
      kin_mem->kin_lrw += kin_mem->kin_m_aa * kin_mem->kin_lrw1;
    }

    if (kin_mem->kin_q_aa == NULL)
    {
      kin_mem->kin_q_aa = N_VCloneVectorArray((int)kin_mem->kin_m_aa, tmpl);
      if (kin_mem->kin_q_aa == NULL)
      {
        N_VDestroy(kin_mem->kin_unew);
        N_VDestroy(kin_mem->kin_fval);
        N_VDestroy(kin_mem->kin_pp);
        N_VDestroy(kin_mem->kin_vtemp1);
        N_VDestroy(kin_mem->kin_vtemp2);
        free(kin_mem->kin_R_aa);
        free(kin_mem->kin_gamma_aa);
        free(kin_mem->kin_cv);
        free(kin_mem->kin_Xv);
        N_VDestroy(kin_mem->kin_fold_aa);
        N_VDestroy(kin_mem->kin_gold_aa);
        N_VDestroyVectorArray(kin_mem->kin_df_aa, (int)kin_mem->kin_m_aa);
        N_VDestroyVectorArray(kin_mem->kin_dg_aa, (int)kin_mem->kin_m_aa);
        kin_mem->kin_liw -= (7 + 2 * kin_mem->kin_m_aa) * kin_mem->kin_liw1;
        kin_mem->kin_lrw -= (7 + 2 * kin_mem->kin_m_aa) * kin_mem->kin_lrw1;
        return (SUNFALSE);
      }
      kin_mem->kin_liw += kin_mem->kin_m_aa * kin_mem->kin_liw1;
      kin_mem->kin_lrw += kin_mem->kin_m_aa * kin_mem->kin_lrw1;
    }

    if (kin_mem->kin_qr_data == NULL)
    {
      kin_mem->kin_qr_data = (SUNQRData)malloc(sizeof *kin_mem->kin_qr_data);
      if (kin_mem->kin_qr_data == NULL)
      {
        N_VDestroy(kin_mem->kin_unew);
        N_VDestroy(kin_mem->kin_fval);
        N_VDestroy(kin_mem->kin_pp);
        N_VDestroy(kin_mem->kin_vtemp1);
        N_VDestroy(kin_mem->kin_vtemp2);
        free(kin_mem->kin_R_aa);
        free(kin_mem->kin_gamma_aa);
        free(kin_mem->kin_cv);
        free(kin_mem->kin_Xv);
        N_VDestroy(kin_mem->kin_fold_aa);
        N_VDestroy(kin_mem->kin_gold_aa);
        N_VDestroyVectorArray(kin_mem->kin_df_aa, (int)kin_mem->kin_m_aa);
        N_VDestroyVectorArray(kin_mem->kin_dg_aa, (int)kin_mem->kin_m_aa);
        N_VDestroyVectorArray(kin_mem->kin_q_aa, (int)kin_mem->kin_m_aa);
        kin_mem->kin_liw -= (7 + 3 * kin_mem->kin_m_aa) * kin_mem->kin_liw1;
        kin_mem->kin_lrw -= (7 + 3 * kin_mem->kin_m_aa) * kin_mem->kin_lrw1;
        return (KIN_MEM_FAIL);
      }
      kin_mem->kin_liw += kin_mem->kin_m_aa * kin_mem->kin_liw1;
      kin_mem->kin_lrw += kin_mem->kin_m_aa * kin_mem->kin_lrw1;
    }

    if (kin_mem->kin_orth_aa != KIN_ORTH_MGS)
    {
      if (kin_mem->kin_vtemp3 == NULL)
      {
        kin_mem->kin_vtemp3 = N_VClone(tmpl);
        if (kin_mem->kin_vtemp3 == NULL)
        {
          N_VDestroy(kin_mem->kin_unew);
          N_VDestroy(kin_mem->kin_fval);
          N_VDestroy(kin_mem->kin_pp);
          N_VDestroy(kin_mem->kin_vtemp1);
          N_VDestroy(kin_mem->kin_vtemp2);
          free(kin_mem->kin_R_aa);
          free(kin_mem->kin_gamma_aa);
          free(kin_mem->kin_cv);
          free(kin_mem->kin_Xv);
          N_VDestroy(kin_mem->kin_fold_aa);
          N_VDestroy(kin_mem->kin_gold_aa);
          N_VDestroyVectorArray(kin_mem->kin_df_aa, (int)kin_mem->kin_m_aa);
          N_VDestroyVectorArray(kin_mem->kin_dg_aa, (int)kin_mem->kin_m_aa);
          N_VDestroyVectorArray(kin_mem->kin_q_aa, (int)kin_mem->kin_m_aa);
          free(kin_mem->kin_qr_data);
          kin_mem->kin_liw -= (7 + 3 * kin_mem->kin_m_aa) * kin_mem->kin_liw1;
          kin_mem->kin_lrw -= (7 + 3 * kin_mem->kin_m_aa) * kin_mem->kin_lrw1;
          return (SUNFALSE);
        }
        kin_mem->kin_liw += kin_mem->kin_liw1;
        kin_mem->kin_lrw += kin_mem->kin_lrw1;
      }

      if (kin_mem->kin_orth_aa == KIN_ORTH_ICWY)
      {
        if (kin_mem->kin_T_aa == NULL)
        {
          kin_mem->kin_T_aa = (sunrealtype*)malloc(
            ((kin_mem->kin_m_aa * kin_mem->kin_m_aa)) * sizeof(sunrealtype));
          if (kin_mem->kin_T_aa == NULL)
          {
            KINProcessError(kin_mem, 0, __LINE__, __func__, __FILE__,
                            MSG_MEM_FAIL);
            N_VDestroy(kin_mem->kin_unew);
            N_VDestroy(kin_mem->kin_fval);
            N_VDestroy(kin_mem->kin_pp);
            N_VDestroy(kin_mem->kin_vtemp1);
            N_VDestroy(kin_mem->kin_vtemp2);
            free(kin_mem->kin_R_aa);
            free(kin_mem->kin_gamma_aa);
            free(kin_mem->kin_cv);
            free(kin_mem->kin_Xv);
            N_VDestroy(kin_mem->kin_fold_aa);
            N_VDestroy(kin_mem->kin_gold_aa);
            N_VDestroyVectorArray(kin_mem->kin_df_aa, (int)kin_mem->kin_m_aa);
            N_VDestroyVectorArray(kin_mem->kin_dg_aa, (int)kin_mem->kin_m_aa);
            N_VDestroyVectorArray(kin_mem->kin_q_aa, (int)kin_mem->kin_m_aa);
            free(kin_mem->kin_qr_data);
            N_VDestroy(kin_mem->kin_vtemp3);
            kin_mem->kin_liw -= (8 + 3 * kin_mem->kin_m_aa) * kin_mem->kin_liw1;
            kin_mem->kin_lrw -= (8 + 3 * kin_mem->kin_m_aa) * kin_mem->kin_lrw1;
            return (KIN_MEM_FAIL);
          }
        }
      }
    }
  }

  return (SUNTRUE);
}